

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclPlatform.cpp
# Opt level: O3

void xmrig::OclPlatform::print(void)

{
  OclPlatform *platform;
  undefined8 *puVar1;
  vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> platforms;
  void *local_58 [2];
  undefined8 *local_48;
  undefined8 *local_40;
  
  get();
  printf("%-28s%zu\n\n","Number of platforms:",(long)local_40 - (long)local_48 >> 4);
  for (puVar1 = local_48; puVar1 != local_40; puVar1 = puVar1 + 2) {
    printf("  %-26s%zu\n","Index:",puVar1[1]);
    OclLib::getString((OclLib *)local_58,(cl_platform_id)*puVar1,0x900);
    printf("  %-26s%s\n","Profile:",local_58[0]);
    if (local_58[0] != (void *)0x0) {
      operator_delete__(local_58[0]);
    }
    OclLib::getString((OclLib *)local_58,(cl_platform_id)*puVar1,0x901);
    printf("  %-26s%s\n","Version:",local_58[0]);
    if (local_58[0] != (void *)0x0) {
      operator_delete__(local_58[0]);
    }
    OclLib::getString((OclLib *)local_58,(cl_platform_id)*puVar1,0x902);
    printf("  %-26s%s\n","Name:",local_58[0]);
    if (local_58[0] != (void *)0x0) {
      operator_delete__(local_58[0]);
    }
    OclLib::getString((OclLib *)local_58,(cl_platform_id)*puVar1,0x903);
    printf("  %-26s%s\n","Vendor:",local_58[0]);
    if (local_58[0] != (void *)0x0) {
      operator_delete__(local_58[0]);
    }
    OclLib::getString((OclLib *)local_58,(cl_platform_id)*puVar1,0x904);
    printf("  %-26s%s\n\n","Extensions:",local_58[0]);
    if (local_58[0] != (void *)0x0) {
      operator_delete__(local_58[0]);
    }
  }
  if (local_48 != (undefined8 *)0x0) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

void xmrig::OclPlatform::print()
{
    const auto platforms = OclPlatform::get();

    printf("%-28s%zu\n\n", "Number of platforms:", platforms.size());

    for (const auto &platform : platforms) {
        printf("  %-26s%zu\n",  "Index:",       platform.index());
        printf("  %-26s%s\n",   "Profile:",     platform.profile().data());
        printf("  %-26s%s\n",   "Version:",     platform.version().data());
        printf("  %-26s%s\n",   "Name:",        platform.name().data());
        printf("  %-26s%s\n",   "Vendor:",      platform.vendor().data());
        printf("  %-26s%s\n\n", "Extensions:",  platform.extensions().data());
    }
}